

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log10floor_manual_::run(Test_intlog_log10floor_manual_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  SourceLocation loc_04;
  SourceLocation loc_05;
  SourceLocation loc_06;
  SourceLocation loc_07;
  SourceLocation loc_08;
  SourceLocation loc_09;
  SourceLocation loc_10;
  SourceLocation loc_11;
  SourceLocation loc_12;
  SourceLocation loc_13;
  SourceLocation loc_14;
  SourceLocation loc_15;
  SourceLocation loc_16;
  SourceLocation loc_17;
  SourceLocation loc_18;
  SourceLocation loc_19;
  SourceLocation loc_20;
  SourceLocation loc_21;
  SourceLocation loc_22;
  SourceLocation loc_23;
  SourceLocation loc_24;
  SourceLocation loc_25;
  SourceLocation loc_26;
  SourceLocation loc_27;
  SourceLocation loc_28;
  SourceLocation loc_29;
  SourceLocation loc_30;
  SourceLocation loc_31;
  SourceLocation loc_32;
  SourceLocation loc_33;
  SourceLocation loc_34;
  SourceLocation loc_35;
  SourceLocation loc_36;
  SourceLocation loc_37;
  SourceLocation loc_38;
  SourceLocation loc_39;
  SourceLocation loc_40;
  SourceLocation loc_41;
  SourceLocation loc_42;
  SourceLocation loc_43;
  SourceLocation loc_44;
  bool bVar1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_3250;
  undefined1 local_322b;
  undefined1 local_322a;
  undefined1 local_3229;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_3228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31a8;
  string_view local_3188;
  undefined4 local_3178;
  uint local_3174;
  Cmp cmp__45;
  uint *tr__45;
  uint **local_3160;
  enable_if_t<std::is_unsigned_v<unsigned_long>,_unsigned_long> *tl__45;
  char *pcStack_3150;
  undefined8 local_3148;
  undefined1 local_313b;
  undefined1 local_313a;
  undefined1 local_3139;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_3138;
  undefined1 local_3113;
  undefined1 local_3112;
  undefined1 local_3111;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_3110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3090;
  string_view local_3070;
  undefined4 local_3060;
  uint local_305c;
  Cmp cmp__44;
  uint *tr__44;
  uint **local_3048;
  enable_if_t<std::is_unsigned_v<unsigned_long>,_unsigned_long> *tl__44;
  char *pcStack_3038;
  undefined8 local_3030;
  undefined1 local_3023;
  undefined1 local_3022;
  undefined1 local_3021;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_3020;
  undefined1 local_2ffb;
  undefined1 local_2ffa;
  undefined1 local_2ff9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2fd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2fb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f78;
  string_view local_2f58;
  undefined4 local_2f48;
  uint local_2f44;
  Cmp cmp__43;
  uint *tr__43;
  uint **local_2f30;
  enable_if_t<std::is_unsigned_v<unsigned_long>,_unsigned_long> *tl__43;
  char *pcStack_2f20;
  undefined8 local_2f18;
  undefined1 local_2f0b;
  undefined1 local_2f0a;
  undefined1 local_2f09;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2f08;
  undefined1 local_2ee3;
  undefined1 local_2ee2;
  undefined1 local_2ee1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2ee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e60;
  string_view local_2e40;
  undefined4 local_2e30;
  uint local_2e2c;
  Cmp cmp__42;
  uint *tr__42;
  uint **local_2e18;
  enable_if_t<std::is_unsigned_v<unsigned_long>,_unsigned_long> *tl__42;
  char *pcStack_2e08;
  undefined8 local_2e00;
  undefined1 local_2df3;
  undefined1 local_2df2;
  undefined1 local_2df1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2df0;
  undefined1 local_2dcb;
  undefined1 local_2dca;
  undefined1 local_2dc9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d48;
  string_view local_2d28;
  undefined4 local_2d18;
  uint local_2d14;
  Cmp cmp__41;
  uint *tr__41;
  uint *local_2d00;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__41;
  char *pcStack_2cf0;
  undefined8 local_2ce8;
  undefined1 local_2cdb;
  undefined1 local_2cda;
  undefined1 local_2cd9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2cd8;
  undefined1 local_2cb3;
  undefined1 local_2cb2;
  undefined1 local_2cb1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c30;
  string_view local_2c10;
  undefined4 local_2c00;
  uint local_2bfc;
  Cmp cmp__40;
  uint *tr__40;
  uint *local_2be8;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__40;
  char *pcStack_2bd8;
  undefined8 local_2bd0;
  undefined1 local_2bc3;
  undefined1 local_2bc2;
  undefined1 local_2bc1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2bc0;
  undefined1 local_2b9b;
  undefined1 local_2b9a;
  undefined1 local_2b99;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b18;
  string_view local_2af8;
  undefined4 local_2ae8;
  uint local_2ae4;
  Cmp cmp__39;
  uint *tr__39;
  uint *local_2ad0;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__39;
  char *pcStack_2ac0;
  undefined8 local_2ab8;
  undefined1 local_2aab;
  undefined1 local_2aaa;
  undefined1 local_2aa9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2aa8;
  undefined1 local_2a83;
  undefined1 local_2a82;
  undefined1 local_2a81;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a00;
  string_view local_29e0;
  undefined4 local_29d0;
  uint local_29cc;
  Cmp cmp__38;
  uint *tr__38;
  uint *local_29b8;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__38;
  char *pcStack_29a8;
  undefined8 local_29a0;
  undefined1 local_2993;
  undefined1 local_2992;
  undefined1 local_2991;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2990;
  undefined1 local_296b;
  undefined1 local_296a;
  undefined1 local_2969;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28e8;
  string_view local_28c8;
  undefined4 local_28b8;
  uint local_28b4;
  Cmp cmp__37;
  uint *tr__37;
  uint *local_28a0;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__37;
  char *pcStack_2890;
  undefined8 local_2888;
  undefined1 local_287b;
  undefined1 local_287a;
  undefined1 local_2879;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2878;
  undefined1 local_2853;
  undefined1 local_2852;
  undefined1 local_2851;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27d0;
  string_view local_27b0;
  undefined4 local_27a0;
  uint local_279c;
  Cmp cmp__36;
  uint *tr__36;
  uint *local_2788;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__36;
  char *pcStack_2778;
  undefined8 local_2770;
  undefined1 local_2763;
  undefined1 local_2762;
  undefined1 local_2761;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2760;
  undefined1 local_273b;
  undefined1 local_273a;
  undefined1 local_2739;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26b8;
  string_view local_2698;
  undefined4 local_2688;
  uint local_2684;
  Cmp cmp__35;
  uint *tr__35;
  uint *local_2670;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__35;
  char *pcStack_2660;
  undefined8 local_2658;
  undefined1 local_264b;
  undefined1 local_264a;
  undefined1 local_2649;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2648;
  undefined1 local_2623;
  undefined1 local_2622;
  undefined1 local_2621;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25a0;
  string_view local_2580;
  undefined4 local_2570;
  uint local_256c;
  Cmp cmp__34;
  uint *tr__34;
  uint *local_2558;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__34;
  char *pcStack_2548;
  undefined8 local_2540;
  undefined1 local_2533;
  undefined1 local_2532;
  undefined1 local_2531;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2530;
  undefined1 local_250b;
  undefined1 local_250a;
  undefined1 local_2509;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2488;
  string_view local_2468;
  undefined4 local_2458;
  uint local_2454;
  Cmp cmp__33;
  uint *tr__33;
  uint *local_2440;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__33;
  char *pcStack_2430;
  undefined8 local_2428;
  undefined1 local_241b;
  undefined1 local_241a;
  undefined1 local_2419;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2418;
  undefined1 local_23f3;
  undefined1 local_23f2;
  undefined1 local_23f1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_23f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2370;
  string_view local_2350;
  undefined4 local_2340;
  uint local_233c;
  Cmp cmp__32;
  uint *tr__32;
  uint *local_2328;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__32;
  char *pcStack_2318;
  undefined8 local_2310;
  undefined1 local_2303;
  undefined1 local_2302;
  undefined1 local_2301;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_2300;
  undefined1 local_22db;
  undefined1 local_22da;
  undefined1 local_22d9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_22d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2258;
  string_view local_2238;
  undefined4 local_2228;
  uint local_2224;
  Cmp cmp__31;
  uint *tr__31;
  uint *local_2210;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__31;
  char *pcStack_2200;
  undefined8 local_21f8;
  undefined1 local_21eb;
  undefined1 local_21ea;
  undefined1 local_21e9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_21e8;
  undefined1 local_21c3;
  undefined1 local_21c2;
  undefined1 local_21c1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_21c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2140;
  string_view local_2120;
  undefined4 local_2110;
  uint local_210c;
  Cmp cmp__30;
  uint *tr__30;
  uint *local_20f8;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__30;
  char *pcStack_20e8;
  undefined8 local_20e0;
  undefined1 local_20d3;
  undefined1 local_20d2;
  undefined1 local_20d1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_20d0;
  undefined1 local_20ab;
  undefined1 local_20aa;
  undefined1 local_20a9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_20a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2028;
  string_view local_2008;
  undefined4 local_1ff8;
  uint local_1ff4;
  Cmp cmp__29;
  uint *tr__29;
  uint *local_1fe0;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__29;
  char *pcStack_1fd0;
  undefined8 local_1fc8;
  undefined1 local_1fbb;
  undefined1 local_1fba;
  undefined1 local_1fb9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1fb8;
  undefined1 local_1f93;
  undefined1 local_1f92;
  undefined1 local_1f91;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1f90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f10;
  string_view local_1ef0;
  undefined4 local_1ee0;
  uint local_1edc;
  Cmp cmp__28;
  uint *tr__28;
  uint *local_1ec8;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__28;
  char *pcStack_1eb8;
  undefined8 local_1eb0;
  undefined1 local_1ea3;
  undefined1 local_1ea2;
  undefined1 local_1ea1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1ea0;
  undefined1 local_1e7b;
  undefined1 local_1e7a;
  undefined1 local_1e79;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1df8;
  string_view local_1dd8;
  undefined4 local_1dc8;
  uint local_1dc4;
  Cmp cmp__27;
  uint *tr__27;
  uint *local_1db0;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__27;
  char *pcStack_1da0;
  undefined8 local_1d98;
  undefined1 local_1d8b;
  undefined1 local_1d8a;
  undefined1 local_1d89;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1d88;
  undefined1 local_1d63;
  undefined1 local_1d62;
  undefined1 local_1d61;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ce0;
  string_view local_1cc0;
  undefined4 local_1cb0;
  uint local_1cac;
  Cmp cmp__26;
  uint *tr__26;
  uint *local_1c98;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__26;
  char *pcStack_1c88;
  undefined8 local_1c80;
  undefined1 local_1c73;
  undefined1 local_1c72;
  undefined1 local_1c71;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1c70;
  undefined1 local_1c4b;
  undefined1 local_1c4a;
  undefined1 local_1c49;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bc8;
  string_view local_1ba8;
  undefined4 local_1b98;
  uint local_1b94;
  Cmp cmp__25;
  uint *tr__25;
  uint *local_1b80;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__25;
  char *pcStack_1b70;
  undefined8 local_1b68;
  undefined1 local_1b5b;
  undefined1 local_1b5a;
  undefined1 local_1b59;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1b58;
  undefined1 local_1b33;
  undefined1 local_1b32;
  undefined1 local_1b31;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ab0;
  string_view local_1a90;
  undefined4 local_1a80;
  uint local_1a7c;
  Cmp cmp__24;
  uint *tr__24;
  uint *local_1a68;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__24;
  char *pcStack_1a58;
  undefined8 local_1a50;
  undefined1 local_1a43;
  undefined1 local_1a42;
  undefined1 local_1a41;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1a40;
  undefined1 local_1a1b;
  undefined1 local_1a1a;
  undefined1 local_1a19;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1998;
  string_view local_1978;
  undefined4 local_1968;
  uint local_1964;
  Cmp cmp__23;
  uint *tr__23;
  uint *local_1950;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__23;
  char *pcStack_1940;
  undefined8 local_1938;
  undefined1 local_192b;
  undefined1 local_192a;
  undefined1 local_1929;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1928;
  undefined1 local_1903;
  undefined1 local_1902;
  undefined1 local_1901;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1880;
  string_view local_1860;
  undefined4 local_1850;
  uint local_184c;
  Cmp cmp__22;
  uint *tr__22;
  uint *local_1838;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__22;
  char *pcStack_1828;
  undefined8 local_1820;
  undefined1 local_1813;
  undefined1 local_1812;
  undefined1 local_1811;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1810;
  undefined1 local_17eb;
  undefined1 local_17ea;
  undefined1 local_17e9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_17e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1768;
  string_view local_1748;
  undefined4 local_1738;
  uint local_1734;
  Cmp cmp__21;
  uint *tr__21;
  uint *local_1720;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__21;
  char *pcStack_1710;
  undefined8 local_1708;
  undefined1 local_16fb;
  undefined1 local_16fa;
  undefined1 local_16f9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_16f8;
  undefined1 local_16d3;
  undefined1 local_16d2;
  undefined1 local_16d1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_16d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1650;
  string_view local_1630;
  undefined4 local_1620;
  uint local_161c;
  Cmp cmp__20;
  uint *tr__20;
  uint *local_1608;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__20;
  char *pcStack_15f8;
  undefined8 local_15f0;
  undefined1 local_15e3;
  undefined1 local_15e2;
  undefined1 local_15e1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_15e0;
  undefined1 local_15bb;
  undefined1 local_15ba;
  undefined1 local_15b9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_15b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1538;
  string_view local_1518;
  undefined4 local_1508;
  uint local_1504;
  Cmp cmp__19;
  uint *tr__19;
  uint *local_14f0;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__19;
  char *pcStack_14e0;
  undefined8 local_14d8;
  undefined1 local_14cb;
  undefined1 local_14ca;
  undefined1 local_14c9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_14c8;
  undefined1 local_14a3;
  undefined1 local_14a2;
  undefined1 local_14a1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_14a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1420;
  string_view local_1400;
  undefined4 local_13f0;
  uint local_13ec;
  Cmp cmp__18;
  uint *tr__18;
  uint *local_13d8;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__18;
  char *pcStack_13c8;
  undefined8 local_13c0;
  undefined1 local_13b3;
  undefined1 local_13b2;
  undefined1 local_13b1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_13b0;
  undefined1 local_138b;
  undefined1 local_138a;
  undefined1 local_1389;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1308;
  string_view local_12e8;
  undefined4 local_12d8;
  uint local_12d4;
  Cmp cmp__17;
  uint *tr__17;
  uint *local_12c0;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__17;
  char *pcStack_12b0;
  undefined8 local_12a8;
  undefined1 local_129b;
  undefined1 local_129a;
  undefined1 local_1299;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1298;
  undefined1 local_1273;
  undefined1 local_1272;
  undefined1 local_1271;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f0;
  string_view local_11d0;
  undefined4 local_11c0;
  uint local_11bc;
  Cmp cmp__16;
  uint *tr__16;
  uint *local_11a8;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__16;
  char *pcStack_1198;
  undefined8 local_1190;
  undefined1 local_1183;
  undefined1 local_1182;
  undefined1 local_1181;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1180;
  undefined1 local_115b;
  undefined1 local_115a;
  undefined1 local_1159;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  string_view local_10b8;
  undefined4 local_10a8;
  uint local_10a4;
  Cmp cmp__15;
  uint *tr__15;
  uint *local_1090;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__15;
  char *pcStack_1080;
  undefined8 local_1078;
  undefined1 local_106b;
  undefined1 local_106a;
  undefined1 local_1069;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1068;
  undefined1 local_1043;
  undefined1 local_1042;
  undefined1 local_1041;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_1040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1000;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  string_view local_fa0;
  undefined4 local_f90;
  uint local_f8c;
  Cmp cmp__14;
  uint *tr__14;
  uint *local_f78;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__14;
  char *pcStack_f68;
  undefined8 local_f60;
  undefined1 local_f53;
  undefined1 local_f52;
  undefined1 local_f51;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_f50;
  undefined1 local_f2b;
  undefined1 local_f2a;
  undefined1 local_f29;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_f28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea8;
  string_view local_e88;
  undefined4 local_e78;
  uint local_e74;
  Cmp cmp__13;
  uint *tr__13;
  uint *local_e60;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__13;
  char *pcStack_e50;
  undefined8 local_e48;
  undefined1 local_e3b;
  undefined1 local_e3a;
  undefined1 local_e39;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_e38;
  undefined1 local_e13;
  undefined1 local_e12;
  undefined1 local_e11;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  string_view local_d70;
  undefined4 local_d60;
  uint local_d5c;
  Cmp cmp__12;
  uint *tr__12;
  uint *local_d48;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__12;
  char *pcStack_d38;
  undefined8 local_d30;
  undefined1 local_d23;
  undefined1 local_d22;
  undefined1 local_d21;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_d20;
  undefined1 local_cfb;
  undefined1 local_cfa;
  undefined1 local_cf9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  string_view local_c58;
  undefined4 local_c48;
  uint local_c44;
  Cmp cmp__11;
  uint *tr__11;
  uint *local_c30;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__11;
  char *pcStack_c20;
  undefined8 local_c18;
  undefined1 local_c0b;
  undefined1 local_c0a;
  undefined1 local_c09;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_c08;
  undefined1 local_be3;
  undefined1 local_be2;
  undefined1 local_be1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  string_view local_b40;
  undefined4 local_b30;
  uint local_b2c;
  Cmp cmp__10;
  uint *tr__10;
  uint *local_b18;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__10;
  char *pcStack_b08;
  undefined8 local_b00;
  undefined1 local_af3;
  undefined1 local_af2;
  undefined1 local_af1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_af0;
  undefined1 local_acb;
  undefined1 local_aca;
  undefined1 local_ac9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  string_view local_a28;
  undefined4 local_a18;
  uint local_a14;
  Cmp cmp__9;
  uint *tr__9;
  uint *local_a00;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__9;
  char *pcStack_9f0;
  undefined8 local_9e8;
  undefined1 local_9db;
  undefined1 local_9da;
  undefined1 local_9d9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_9d8;
  undefined1 local_9b3;
  undefined1 local_9b2;
  undefined1 local_9b1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  string_view local_910;
  undefined4 local_900;
  uint local_8fc;
  Cmp cmp__8;
  uint *tr__8;
  uint *local_8e8;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__8;
  char *pcStack_8d8;
  undefined8 local_8d0;
  undefined1 local_8c3;
  undefined1 local_8c2;
  undefined1 local_8c1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_8c0;
  undefined1 local_89b;
  undefined1 local_89a;
  undefined1 local_899;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  string_view local_7f8;
  undefined4 local_7e8;
  uint local_7e4;
  Cmp cmp__7;
  uint *tr__7;
  uint *local_7d0;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__7;
  char *pcStack_7c0;
  undefined8 local_7b8;
  undefined1 local_7ab;
  undefined1 local_7aa;
  undefined1 local_7a9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_7a8;
  undefined1 local_783;
  undefined1 local_782;
  undefined1 local_781;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  string_view local_6e0;
  undefined4 local_6d0;
  uint local_6cc;
  Cmp cmp__6;
  uint *tr__6;
  uint *local_6b8;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *tl__6;
  char *pcStack_6a8;
  undefined8 local_6a0;
  undefined1 local_693;
  undefined1 local_692;
  undefined1 local_691;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_690;
  undefined1 local_66b;
  undefined1 local_66a;
  undefined1 local_669;
  enable_if_t<isStringifieable<unsigned_char>,_std::string> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  string_view local_5c8;
  undefined4 local_5b8;
  uint local_5b4;
  Cmp cmp__5;
  uint *tr__5;
  uchar *local_5a0;
  enable_if_t<std::is_unsigned_v<unsigned_char>,_unsigned_char> *tl__5;
  char *pcStack_590;
  undefined8 local_588;
  undefined1 local_57b;
  undefined1 local_57a;
  undefined1 local_579;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_578;
  undefined1 local_553;
  undefined1 local_552;
  undefined1 local_551;
  enable_if_t<isStringifieable<unsigned_char>,_std::string> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string_view local_4b0;
  undefined4 local_4a0;
  uint local_49c;
  Cmp cmp__4;
  uint *tr__4;
  uchar *local_488;
  enable_if_t<std::is_unsigned_v<unsigned_char>,_unsigned_char> *tl__4;
  char *pcStack_478;
  undefined8 local_470;
  undefined1 local_463;
  undefined1 local_462;
  undefined1 local_461;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_460;
  undefined1 local_43b;
  undefined1 local_43a;
  undefined1 local_439;
  enable_if_t<isStringifieable<unsigned_char>,_std::string> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string_view local_398;
  undefined4 local_388;
  uint local_384;
  Cmp cmp__3;
  uint *tr__3;
  uchar *local_370;
  enable_if_t<std::is_unsigned_v<unsigned_char>,_unsigned_char> *tl__3;
  char *pcStack_360;
  undefined8 local_358;
  undefined1 local_34b;
  undefined1 local_34a;
  undefined1 local_349;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_348;
  undefined1 local_323;
  undefined1 local_322;
  undefined1 local_321;
  enable_if_t<isStringifieable<unsigned_char>,_std::string> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string_view local_280;
  undefined4 local_270;
  uint local_26c;
  Cmp cmp__2;
  uint *tr__2;
  uchar *local_258;
  enable_if_t<std::is_unsigned_v<unsigned_char>,_unsigned_char> *tl__2;
  char *pcStack_248;
  undefined8 local_240;
  undefined1 local_233;
  undefined1 local_232;
  undefined1 local_231;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_230;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  enable_if_t<isStringifieable<unsigned_char>,_std::string> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string_view local_168;
  undefined4 local_158;
  uint local_154;
  Cmp cmp__1;
  uint *tr__1;
  uchar *local_140;
  enable_if_t<std::is_unsigned_v<unsigned_char>,_unsigned_char> *tl__1;
  char *pcStack_130;
  undefined8 local_128;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_118;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_e1;
  enable_if_t<isStringifieable<unsigned_char>,_std::string> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_view local_40;
  undefined4 local_30;
  uint local_2c;
  Cmp cmp_;
  uint *tr_;
  uchar *local_18;
  enable_if_t<std::is_unsigned_v<unsigned_char>,_unsigned_char> *tl_;
  Test_intlog_log10floor_manual_ *this_local;
  
  tl_ = (enable_if_t<std::is_unsigned_v<unsigned_char>,_unsigned_char> *)this;
  tr_._7_1_ = log10floor<unsigned_char>('\0');
  local_18 = (uchar *)((long)&tr_ + 7);
  local_2c = 0;
  _cmp_ = &local_2c;
  local_30 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_char,unsigned_int>(local_18,_cmp_);
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  if (!bVar1) {
    stringify<unsigned_char>(&local_e0,local_18);
    local_e1 = 1;
    std::operator+(&local_c0,
                   "Comparison failed: log10floor<std::uint8_t>(0u) == 0u (with \"log10floor<std::uint8_t>(0u)\"="
                   ,&local_e0);
    local_f5 = 1;
    std::operator+(&local_a0,&local_c0,", \"0u\"=");
    local_f6 = 1;
    stringify<unsigned_int>(&local_118,_cmp_);
    local_119 = 1;
    std::operator+(&local_80,&local_a0,&local_118);
    local_11a = 1;
    std::operator+(&local_60,&local_80,")");
    local_11b = 1;
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
    tl__1 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_130 = "run";
    local_128 = 100;
    loc.function = "run";
    loc.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc.line = 100;
    assertFail(local_40,loc);
  }
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  tr__1._7_1_ = log10floor<unsigned_char>('\t');
  local_140 = (uchar *)((long)&tr__1 + 7);
  local_154 = 0;
  _cmp__1 = &local_154;
  local_158 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_char,unsigned_int>(local_140,_cmp__1);
  local_209 = 0;
  local_20a = 0;
  local_20b = 0;
  local_231 = 0;
  local_232 = 0;
  local_233 = 0;
  if (!bVar1) {
    stringify<unsigned_char>(&local_208,local_140);
    local_209 = 1;
    std::operator+(&local_1e8,
                   "Comparison failed: log10floor<std::uint8_t>(9u) == 0u (with \"log10floor<std::uint8_t>(9u)\"="
                   ,&local_208);
    local_20a = 1;
    std::operator+(&local_1c8,&local_1e8,", \"0u\"=");
    local_20b = 1;
    stringify<unsigned_int>(&local_230,_cmp__1);
    local_231 = 1;
    std::operator+(&local_1a8,&local_1c8,&local_230);
    local_232 = 1;
    std::operator+(&local_188,&local_1a8,")");
    local_233 = 1;
    local_168 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_188);
    tl__2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_248 = "run";
    local_240 = 0x65;
    loc_00.function = "run";
    loc_00.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_00.line = 0x65;
    assertFail(local_168,loc_00);
  }
  local_209 = 0;
  local_20a = 0;
  local_20b = 0;
  local_231 = 0;
  local_232 = 0;
  local_233 = 0;
  tr__2._7_1_ = log10floor<unsigned_char>('\n');
  local_258 = (uchar *)((long)&tr__2 + 7);
  local_26c = 1;
  _cmp__2 = &local_26c;
  local_270 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_char,unsigned_int>(local_258,_cmp__2);
  local_321 = 0;
  local_322 = 0;
  local_323 = 0;
  local_349 = 0;
  local_34a = 0;
  local_34b = 0;
  if (!bVar1) {
    stringify<unsigned_char>(&local_320,local_258);
    local_321 = 1;
    std::operator+(&local_300,
                   "Comparison failed: log10floor<std::uint8_t>(10u) == 1u (with \"log10floor<std::uint8_t>(10u)\"="
                   ,&local_320);
    local_322 = 1;
    std::operator+(&local_2e0,&local_300,", \"1u\"=");
    local_323 = 1;
    stringify<unsigned_int>(&local_348,_cmp__2);
    local_349 = 1;
    std::operator+(&local_2c0,&local_2e0,&local_348);
    local_34a = 1;
    std::operator+(&local_2a0,&local_2c0,")");
    local_34b = 1;
    local_280 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2a0);
    tl__3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_360 = "run";
    local_358 = 0x66;
    loc_01.function = "run";
    loc_01.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_01.line = 0x66;
    assertFail(local_280,loc_01);
  }
  local_321 = 0;
  local_322 = 0;
  local_323 = 0;
  local_349 = 0;
  local_34a = 0;
  local_34b = 0;
  tr__3._7_1_ = log10floor<unsigned_char>('c');
  local_370 = (uchar *)((long)&tr__3 + 7);
  local_384 = 1;
  _cmp__3 = &local_384;
  local_388 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_char,unsigned_int>(local_370,_cmp__3);
  local_439 = 0;
  local_43a = 0;
  local_43b = 0;
  local_461 = 0;
  local_462 = 0;
  local_463 = 0;
  if (!bVar1) {
    stringify<unsigned_char>(&local_438,local_370);
    local_439 = 1;
    std::operator+(&local_418,
                   "Comparison failed: log10floor<std::uint8_t>(99u) == 1u (with \"log10floor<std::uint8_t>(99u)\"="
                   ,&local_438);
    local_43a = 1;
    std::operator+(&local_3f8,&local_418,", \"1u\"=");
    local_43b = 1;
    stringify<unsigned_int>(&local_460,_cmp__3);
    local_461 = 1;
    std::operator+(&local_3d8,&local_3f8,&local_460);
    local_462 = 1;
    std::operator+(&local_3b8,&local_3d8,")");
    local_463 = 1;
    local_398 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3b8);
    tl__4 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_478 = "run";
    local_470 = 0x67;
    loc_02.function = "run";
    loc_02.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_02.line = 0x67;
    assertFail(local_398,loc_02);
  }
  local_439 = 0;
  local_43a = 0;
  local_43b = 0;
  local_461 = 0;
  local_462 = 0;
  local_463 = 0;
  tr__4._7_1_ = log10floor<unsigned_char>('d');
  local_488 = (uchar *)((long)&tr__4 + 7);
  local_49c = 2;
  _cmp__4 = &local_49c;
  local_4a0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_char,unsigned_int>(local_488,_cmp__4);
  local_551 = 0;
  local_552 = 0;
  local_553 = 0;
  local_579 = 0;
  local_57a = 0;
  local_57b = 0;
  if (!bVar1) {
    stringify<unsigned_char>(&local_550,local_488);
    local_551 = 1;
    std::operator+(&local_530,
                   "Comparison failed: log10floor<std::uint8_t>(100u) == 2u (with \"log10floor<std::uint8_t>(100u)\"="
                   ,&local_550);
    local_552 = 1;
    std::operator+(&local_510,&local_530,", \"2u\"=");
    local_553 = 1;
    stringify<unsigned_int>(&local_578,_cmp__4);
    local_579 = 1;
    std::operator+(&local_4f0,&local_510,&local_578);
    local_57a = 1;
    std::operator+(&local_4d0,&local_4f0,")");
    local_57b = 1;
    local_4b0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4d0);
    tl__5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_590 = "run";
    local_588 = 0x68;
    loc_03.function = "run";
    loc_03.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_03.line = 0x68;
    assertFail(local_4b0,loc_03);
  }
  local_551 = 0;
  local_552 = 0;
  local_553 = 0;
  local_579 = 0;
  local_57a = 0;
  local_57b = 0;
  tr__5._7_1_ = log10floor<unsigned_char>(0xff);
  local_5a0 = (uchar *)((long)&tr__5 + 7);
  local_5b4 = 2;
  _cmp__5 = &local_5b4;
  local_5b8 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_char,unsigned_int>(local_5a0,_cmp__5);
  local_669 = 0;
  local_66a = 0;
  local_66b = 0;
  local_691 = 0;
  local_692 = 0;
  local_693 = 0;
  if (!bVar1) {
    stringify<unsigned_char>(&local_668,local_5a0);
    local_669 = 1;
    std::operator+(&local_648,
                   "Comparison failed: log10floor<std::uint8_t>(255u) == 2u (with \"log10floor<std::uint8_t>(255u)\"="
                   ,&local_668);
    local_66a = 1;
    std::operator+(&local_628,&local_648,", \"2u\"=");
    local_66b = 1;
    stringify<unsigned_int>(&local_690,_cmp__5);
    local_691 = 1;
    std::operator+(&local_608,&local_628,&local_690);
    local_692 = 1;
    std::operator+(&local_5e8,&local_608,")");
    local_693 = 1;
    local_5c8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_5e8);
    tl__6 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_6a8 = "run";
    local_6a0 = 0x69;
    loc_04.function = "run";
    loc_04.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_04.line = 0x69;
    assertFail(local_5c8,loc_04);
  }
  local_669 = 0;
  local_66a = 0;
  local_66b = 0;
  local_691 = 0;
  local_692 = 0;
  local_693 = 0;
  tr__6._4_4_ = log10floor<unsigned_int>(0);
  local_6b8 = (uint *)((long)&tr__6 + 4);
  local_6cc = 0;
  _cmp__6 = &local_6cc;
  local_6d0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_6b8,_cmp__6);
  local_781 = 0;
  local_782 = 0;
  local_783 = 0;
  local_7a9 = 0;
  local_7aa = 0;
  local_7ab = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_780,local_6b8);
    local_781 = 1;
    std::operator+(&local_760,
                   "Comparison failed: log10floor<std::uint32_t>(0u) == 0u (with \"log10floor<std::uint32_t>(0u)\"="
                   ,&local_780);
    local_782 = 1;
    std::operator+(&local_740,&local_760,", \"0u\"=");
    local_783 = 1;
    stringify<unsigned_int>(&local_7a8,_cmp__6);
    local_7a9 = 1;
    std::operator+(&local_720,&local_740,&local_7a8);
    local_7aa = 1;
    std::operator+(&local_700,&local_720,")");
    local_7ab = 1;
    local_6e0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_700);
    tl__7 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_7c0 = "run";
    local_7b8 = 0x6b;
    loc_05.function = "run";
    loc_05.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_05.line = 0x6b;
    assertFail(local_6e0,loc_05);
  }
  local_781 = 0;
  local_782 = 0;
  local_783 = 0;
  local_7a9 = 0;
  local_7aa = 0;
  local_7ab = 0;
  tr__7._4_4_ = log10floor<unsigned_int>(1);
  local_7d0 = (uint *)((long)&tr__7 + 4);
  local_7e4 = 0;
  _cmp__7 = &local_7e4;
  local_7e8 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_7d0,_cmp__7);
  local_899 = 0;
  local_89a = 0;
  local_89b = 0;
  local_8c1 = 0;
  local_8c2 = 0;
  local_8c3 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_898,local_7d0);
    local_899 = 1;
    std::operator+(&local_878,
                   "Comparison failed: log10floor<std::uint32_t>(1u) == 0u (with \"log10floor<std::uint32_t>(1u)\"="
                   ,&local_898);
    local_89a = 1;
    std::operator+(&local_858,&local_878,", \"0u\"=");
    local_89b = 1;
    stringify<unsigned_int>(&local_8c0,_cmp__7);
    local_8c1 = 1;
    std::operator+(&local_838,&local_858,&local_8c0);
    local_8c2 = 1;
    std::operator+(&local_818,&local_838,")");
    local_8c3 = 1;
    local_7f8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_818);
    tl__8 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_8d8 = "run";
    local_8d0 = 0x6c;
    loc_06.function = "run";
    loc_06.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_06.line = 0x6c;
    assertFail(local_7f8,loc_06);
  }
  local_899 = 0;
  local_89a = 0;
  local_89b = 0;
  local_8c1 = 0;
  local_8c2 = 0;
  local_8c3 = 0;
  tr__8._4_4_ = log10floor<unsigned_int>(2);
  local_8e8 = (uint *)((long)&tr__8 + 4);
  local_8fc = 0;
  _cmp__8 = &local_8fc;
  local_900 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_8e8,_cmp__8);
  local_9b1 = 0;
  local_9b2 = 0;
  local_9b3 = 0;
  local_9d9 = 0;
  local_9da = 0;
  local_9db = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_9b0,local_8e8);
    local_9b1 = 1;
    std::operator+(&local_990,
                   "Comparison failed: log10floor<std::uint32_t>(2u) == 0u (with \"log10floor<std::uint32_t>(2u)\"="
                   ,&local_9b0);
    local_9b2 = 1;
    std::operator+(&local_970,&local_990,", \"0u\"=");
    local_9b3 = 1;
    stringify<unsigned_int>(&local_9d8,_cmp__8);
    local_9d9 = 1;
    std::operator+(&local_950,&local_970,&local_9d8);
    local_9da = 1;
    std::operator+(&local_930,&local_950,")");
    local_9db = 1;
    local_910 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_930);
    tl__9 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_9f0 = "run";
    local_9e8 = 0x6d;
    loc_07.function = "run";
    loc_07.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_07.line = 0x6d;
    assertFail(local_910,loc_07);
  }
  local_9b1 = 0;
  local_9b2 = 0;
  local_9b3 = 0;
  local_9d9 = 0;
  local_9da = 0;
  local_9db = 0;
  tr__9._4_4_ = log10floor<unsigned_int>(3);
  local_a00 = (uint *)((long)&tr__9 + 4);
  local_a14 = 0;
  _cmp__9 = &local_a14;
  local_a18 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_a00,_cmp__9);
  local_ac9 = 0;
  local_aca = 0;
  local_acb = 0;
  local_af1 = 0;
  local_af2 = 0;
  local_af3 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_ac8,local_a00);
    local_ac9 = 1;
    std::operator+(&local_aa8,
                   "Comparison failed: log10floor<std::uint32_t>(3u) == 0u (with \"log10floor<std::uint32_t>(3u)\"="
                   ,&local_ac8);
    local_aca = 1;
    std::operator+(&local_a88,&local_aa8,", \"0u\"=");
    local_acb = 1;
    stringify<unsigned_int>(&local_af0,_cmp__9);
    local_af1 = 1;
    std::operator+(&local_a68,&local_a88,&local_af0);
    local_af2 = 1;
    std::operator+(&local_a48,&local_a68,")");
    local_af3 = 1;
    local_a28 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a48);
    tl__10 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_b08 = "run";
    local_b00 = 0x6e;
    loc_08.function = "run";
    loc_08.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_08.line = 0x6e;
    assertFail(local_a28,loc_08);
  }
  local_ac9 = 0;
  local_aca = 0;
  local_acb = 0;
  local_af1 = 0;
  local_af2 = 0;
  local_af3 = 0;
  tr__10._4_4_ = log10floor<unsigned_int>(4);
  local_b18 = (uint *)((long)&tr__10 + 4);
  local_b2c = 0;
  _cmp__10 = &local_b2c;
  local_b30 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_b18,_cmp__10);
  local_be1 = 0;
  local_be2 = 0;
  local_be3 = 0;
  local_c09 = 0;
  local_c0a = 0;
  local_c0b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_be0,local_b18);
    local_be1 = 1;
    std::operator+(&local_bc0,
                   "Comparison failed: log10floor<std::uint32_t>(4u) == 0u (with \"log10floor<std::uint32_t>(4u)\"="
                   ,&local_be0);
    local_be2 = 1;
    std::operator+(&local_ba0,&local_bc0,", \"0u\"=");
    local_be3 = 1;
    stringify<unsigned_int>(&local_c08,_cmp__10);
    local_c09 = 1;
    std::operator+(&local_b80,&local_ba0,&local_c08);
    local_c0a = 1;
    std::operator+(&local_b60,&local_b80,")");
    local_c0b = 1;
    local_b40 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b60);
    tl__11 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_c20 = "run";
    local_c18 = 0x6f;
    loc_09.function = "run";
    loc_09.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_09.line = 0x6f;
    assertFail(local_b40,loc_09);
  }
  local_be1 = 0;
  local_be2 = 0;
  local_be3 = 0;
  local_c09 = 0;
  local_c0a = 0;
  local_c0b = 0;
  tr__11._4_4_ = log10floor<unsigned_int>(5);
  local_c30 = (uint *)((long)&tr__11 + 4);
  local_c44 = 0;
  _cmp__11 = &local_c44;
  local_c48 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_c30,_cmp__11);
  local_cf9 = 0;
  local_cfa = 0;
  local_cfb = 0;
  local_d21 = 0;
  local_d22 = 0;
  local_d23 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_cf8,local_c30);
    local_cf9 = 1;
    std::operator+(&local_cd8,
                   "Comparison failed: log10floor<std::uint32_t>(5u) == 0u (with \"log10floor<std::uint32_t>(5u)\"="
                   ,&local_cf8);
    local_cfa = 1;
    std::operator+(&local_cb8,&local_cd8,", \"0u\"=");
    local_cfb = 1;
    stringify<unsigned_int>(&local_d20,_cmp__11);
    local_d21 = 1;
    std::operator+(&local_c98,&local_cb8,&local_d20);
    local_d22 = 1;
    std::operator+(&local_c78,&local_c98,")");
    local_d23 = 1;
    local_c58 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c78);
    tl__12 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_d38 = "run";
    local_d30 = 0x70;
    loc_10.function = "run";
    loc_10.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_10.line = 0x70;
    assertFail(local_c58,loc_10);
  }
  local_cf9 = 0;
  local_cfa = 0;
  local_cfb = 0;
  local_d21 = 0;
  local_d22 = 0;
  local_d23 = 0;
  tr__12._4_4_ = log10floor<unsigned_int>(6);
  local_d48 = (uint *)((long)&tr__12 + 4);
  local_d5c = 0;
  _cmp__12 = &local_d5c;
  local_d60 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_d48,_cmp__12);
  local_e11 = 0;
  local_e12 = 0;
  local_e13 = 0;
  local_e39 = 0;
  local_e3a = 0;
  local_e3b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_e10,local_d48);
    local_e11 = 1;
    std::operator+(&local_df0,
                   "Comparison failed: log10floor<std::uint32_t>(6u) == 0u (with \"log10floor<std::uint32_t>(6u)\"="
                   ,&local_e10);
    local_e12 = 1;
    std::operator+(&local_dd0,&local_df0,", \"0u\"=");
    local_e13 = 1;
    stringify<unsigned_int>(&local_e38,_cmp__12);
    local_e39 = 1;
    std::operator+(&local_db0,&local_dd0,&local_e38);
    local_e3a = 1;
    std::operator+(&local_d90,&local_db0,")");
    local_e3b = 1;
    local_d70 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d90);
    tl__13 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_e50 = "run";
    local_e48 = 0x71;
    loc_11.function = "run";
    loc_11.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_11.line = 0x71;
    assertFail(local_d70,loc_11);
  }
  local_e11 = 0;
  local_e12 = 0;
  local_e13 = 0;
  local_e39 = 0;
  local_e3a = 0;
  local_e3b = 0;
  tr__13._4_4_ = log10floor<unsigned_int>(7);
  local_e60 = (uint *)((long)&tr__13 + 4);
  local_e74 = 0;
  _cmp__13 = &local_e74;
  local_e78 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_e60,_cmp__13);
  local_f29 = 0;
  local_f2a = 0;
  local_f2b = 0;
  local_f51 = 0;
  local_f52 = 0;
  local_f53 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_f28,local_e60);
    local_f29 = 1;
    std::operator+(&local_f08,
                   "Comparison failed: log10floor<std::uint32_t>(7u) == 0u (with \"log10floor<std::uint32_t>(7u)\"="
                   ,&local_f28);
    local_f2a = 1;
    std::operator+(&local_ee8,&local_f08,", \"0u\"=");
    local_f2b = 1;
    stringify<unsigned_int>(&local_f50,_cmp__13);
    local_f51 = 1;
    std::operator+(&local_ec8,&local_ee8,&local_f50);
    local_f52 = 1;
    std::operator+(&local_ea8,&local_ec8,")");
    local_f53 = 1;
    local_e88 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_ea8);
    tl__14 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_f68 = "run";
    local_f60 = 0x72;
    loc_12.function = "run";
    loc_12.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_12.line = 0x72;
    assertFail(local_e88,loc_12);
  }
  local_f29 = 0;
  local_f2a = 0;
  local_f2b = 0;
  local_f51 = 0;
  local_f52 = 0;
  local_f53 = 0;
  tr__14._4_4_ = log10floor<unsigned_int>(8);
  local_f78 = (uint *)((long)&tr__14 + 4);
  local_f8c = 0;
  _cmp__14 = &local_f8c;
  local_f90 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_f78,_cmp__14);
  local_1041 = 0;
  local_1042 = 0;
  local_1043 = 0;
  local_1069 = 0;
  local_106a = 0;
  local_106b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1040,local_f78);
    local_1041 = 1;
    std::operator+(&local_1020,
                   "Comparison failed: log10floor<std::uint32_t>(8u) == 0u (with \"log10floor<std::uint32_t>(8u)\"="
                   ,&local_1040);
    local_1042 = 1;
    std::operator+(&local_1000,&local_1020,", \"0u\"=");
    local_1043 = 1;
    stringify<unsigned_int>(&local_1068,_cmp__14);
    local_1069 = 1;
    std::operator+(&local_fe0,&local_1000,&local_1068);
    local_106a = 1;
    std::operator+(&local_fc0,&local_fe0,")");
    local_106b = 1;
    local_fa0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_fc0);
    tl__15 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1080 = "run";
    local_1078 = 0x73;
    loc_13.function = "run";
    loc_13.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_13.line = 0x73;
    assertFail(local_fa0,loc_13);
  }
  local_1041 = 0;
  local_1042 = 0;
  local_1043 = 0;
  local_1069 = 0;
  local_106a = 0;
  local_106b = 0;
  tr__15._4_4_ = log10floor<unsigned_int>(9);
  local_1090 = (uint *)((long)&tr__15 + 4);
  local_10a4 = 0;
  _cmp__15 = &local_10a4;
  local_10a8 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1090,_cmp__15);
  local_1159 = 0;
  local_115a = 0;
  local_115b = 0;
  local_1181 = 0;
  local_1182 = 0;
  local_1183 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1158,local_1090);
    local_1159 = 1;
    std::operator+(&local_1138,
                   "Comparison failed: log10floor<std::uint32_t>(9u) == 0u (with \"log10floor<std::uint32_t>(9u)\"="
                   ,&local_1158);
    local_115a = 1;
    std::operator+(&local_1118,&local_1138,", \"0u\"=");
    local_115b = 1;
    stringify<unsigned_int>(&local_1180,_cmp__15);
    local_1181 = 1;
    std::operator+(&local_10f8,&local_1118,&local_1180);
    local_1182 = 1;
    std::operator+(&local_10d8,&local_10f8,")");
    local_1183 = 1;
    local_10b8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_10d8);
    tl__16 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1198 = "run";
    local_1190 = 0x74;
    loc_14.function = "run";
    loc_14.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_14.line = 0x74;
    assertFail(local_10b8,loc_14);
  }
  local_1159 = 0;
  local_115a = 0;
  local_115b = 0;
  local_1181 = 0;
  local_1182 = 0;
  local_1183 = 0;
  tr__16._4_4_ = log10floor<unsigned_int>(10);
  local_11a8 = (uint *)((long)&tr__16 + 4);
  local_11bc = 1;
  _cmp__16 = &local_11bc;
  local_11c0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_11a8,_cmp__16);
  local_1271 = 0;
  local_1272 = 0;
  local_1273 = 0;
  local_1299 = 0;
  local_129a = 0;
  local_129b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1270,local_11a8);
    local_1271 = 1;
    std::operator+(&local_1250,
                   "Comparison failed: log10floor<std::uint32_t>(10u) == 1u (with \"log10floor<std::uint32_t>(10u)\"="
                   ,&local_1270);
    local_1272 = 1;
    std::operator+(&local_1230,&local_1250,", \"1u\"=");
    local_1273 = 1;
    stringify<unsigned_int>(&local_1298,_cmp__16);
    local_1299 = 1;
    std::operator+(&local_1210,&local_1230,&local_1298);
    local_129a = 1;
    std::operator+(&local_11f0,&local_1210,")");
    local_129b = 1;
    local_11d0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_11f0);
    tl__17 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_12b0 = "run";
    local_12a8 = 0x75;
    loc_15.function = "run";
    loc_15.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_15.line = 0x75;
    assertFail(local_11d0,loc_15);
  }
  local_1271 = 0;
  local_1272 = 0;
  local_1273 = 0;
  local_1299 = 0;
  local_129a = 0;
  local_129b = 0;
  tr__17._4_4_ = log10floor<unsigned_int>(0xb);
  local_12c0 = (uint *)((long)&tr__17 + 4);
  local_12d4 = 1;
  _cmp__17 = &local_12d4;
  local_12d8 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_12c0,_cmp__17);
  local_1389 = 0;
  local_138a = 0;
  local_138b = 0;
  local_13b1 = 0;
  local_13b2 = 0;
  local_13b3 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1388,local_12c0);
    local_1389 = 1;
    std::operator+(&local_1368,
                   "Comparison failed: log10floor<std::uint32_t>(11u) == 1u (with \"log10floor<std::uint32_t>(11u)\"="
                   ,&local_1388);
    local_138a = 1;
    std::operator+(&local_1348,&local_1368,", \"1u\"=");
    local_138b = 1;
    stringify<unsigned_int>(&local_13b0,_cmp__17);
    local_13b1 = 1;
    std::operator+(&local_1328,&local_1348,&local_13b0);
    local_13b2 = 1;
    std::operator+(&local_1308,&local_1328,")");
    local_13b3 = 1;
    local_12e8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1308);
    tl__18 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_13c8 = "run";
    local_13c0 = 0x76;
    loc_16.function = "run";
    loc_16.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_16.line = 0x76;
    assertFail(local_12e8,loc_16);
  }
  local_1389 = 0;
  local_138a = 0;
  local_138b = 0;
  local_13b1 = 0;
  local_13b2 = 0;
  local_13b3 = 0;
  tr__18._4_4_ = log10floor<unsigned_int>(0xc);
  local_13d8 = (uint *)((long)&tr__18 + 4);
  local_13ec = 1;
  _cmp__18 = &local_13ec;
  local_13f0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_13d8,_cmp__18);
  local_14a1 = 0;
  local_14a2 = 0;
  local_14a3 = 0;
  local_14c9 = 0;
  local_14ca = 0;
  local_14cb = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_14a0,local_13d8);
    local_14a1 = 1;
    std::operator+(&local_1480,
                   "Comparison failed: log10floor<std::uint32_t>(12u) == 1u (with \"log10floor<std::uint32_t>(12u)\"="
                   ,&local_14a0);
    local_14a2 = 1;
    std::operator+(&local_1460,&local_1480,", \"1u\"=");
    local_14a3 = 1;
    stringify<unsigned_int>(&local_14c8,_cmp__18);
    local_14c9 = 1;
    std::operator+(&local_1440,&local_1460,&local_14c8);
    local_14ca = 1;
    std::operator+(&local_1420,&local_1440,")");
    local_14cb = 1;
    local_1400 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1420);
    tl__19 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_14e0 = "run";
    local_14d8 = 0x77;
    loc_17.function = "run";
    loc_17.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_17.line = 0x77;
    assertFail(local_1400,loc_17);
  }
  local_14a1 = 0;
  local_14a2 = 0;
  local_14a3 = 0;
  local_14c9 = 0;
  local_14ca = 0;
  local_14cb = 0;
  tr__19._4_4_ = log10floor<unsigned_int>(0xd);
  local_14f0 = (uint *)((long)&tr__19 + 4);
  local_1504 = 1;
  _cmp__19 = &local_1504;
  local_1508 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_14f0,_cmp__19);
  local_15b9 = 0;
  local_15ba = 0;
  local_15bb = 0;
  local_15e1 = 0;
  local_15e2 = 0;
  local_15e3 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_15b8,local_14f0);
    local_15b9 = 1;
    std::operator+(&local_1598,
                   "Comparison failed: log10floor<std::uint32_t>(13u) == 1u (with \"log10floor<std::uint32_t>(13u)\"="
                   ,&local_15b8);
    local_15ba = 1;
    std::operator+(&local_1578,&local_1598,", \"1u\"=");
    local_15bb = 1;
    stringify<unsigned_int>(&local_15e0,_cmp__19);
    local_15e1 = 1;
    std::operator+(&local_1558,&local_1578,&local_15e0);
    local_15e2 = 1;
    std::operator+(&local_1538,&local_1558,")");
    local_15e3 = 1;
    local_1518 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1538);
    tl__20 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_15f8 = "run";
    local_15f0 = 0x78;
    loc_18.function = "run";
    loc_18.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_18.line = 0x78;
    assertFail(local_1518,loc_18);
  }
  local_15b9 = 0;
  local_15ba = 0;
  local_15bb = 0;
  local_15e1 = 0;
  local_15e2 = 0;
  local_15e3 = 0;
  tr__20._4_4_ = log10floor<unsigned_int>(0xe);
  local_1608 = (uint *)((long)&tr__20 + 4);
  local_161c = 1;
  _cmp__20 = &local_161c;
  local_1620 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1608,_cmp__20);
  local_16d1 = 0;
  local_16d2 = 0;
  local_16d3 = 0;
  local_16f9 = 0;
  local_16fa = 0;
  local_16fb = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_16d0,local_1608);
    local_16d1 = 1;
    std::operator+(&local_16b0,
                   "Comparison failed: log10floor<std::uint32_t>(14u) == 1u (with \"log10floor<std::uint32_t>(14u)\"="
                   ,&local_16d0);
    local_16d2 = 1;
    std::operator+(&local_1690,&local_16b0,", \"1u\"=");
    local_16d3 = 1;
    stringify<unsigned_int>(&local_16f8,_cmp__20);
    local_16f9 = 1;
    std::operator+(&local_1670,&local_1690,&local_16f8);
    local_16fa = 1;
    std::operator+(&local_1650,&local_1670,")");
    local_16fb = 1;
    local_1630 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1650);
    tl__21 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1710 = "run";
    local_1708 = 0x79;
    loc_19.function = "run";
    loc_19.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_19.line = 0x79;
    assertFail(local_1630,loc_19);
  }
  local_16d1 = 0;
  local_16d2 = 0;
  local_16d3 = 0;
  local_16f9 = 0;
  local_16fa = 0;
  local_16fb = 0;
  tr__21._4_4_ = log10floor<unsigned_int>(0xf);
  local_1720 = (uint *)((long)&tr__21 + 4);
  local_1734 = 1;
  _cmp__21 = &local_1734;
  local_1738 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1720,_cmp__21);
  local_17e9 = 0;
  local_17ea = 0;
  local_17eb = 0;
  local_1811 = 0;
  local_1812 = 0;
  local_1813 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_17e8,local_1720);
    local_17e9 = 1;
    std::operator+(&local_17c8,
                   "Comparison failed: log10floor<std::uint32_t>(15u) == 1u (with \"log10floor<std::uint32_t>(15u)\"="
                   ,&local_17e8);
    local_17ea = 1;
    std::operator+(&local_17a8,&local_17c8,", \"1u\"=");
    local_17eb = 1;
    stringify<unsigned_int>(&local_1810,_cmp__21);
    local_1811 = 1;
    std::operator+(&local_1788,&local_17a8,&local_1810);
    local_1812 = 1;
    std::operator+(&local_1768,&local_1788,")");
    local_1813 = 1;
    local_1748 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1768);
    tl__22 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1828 = "run";
    local_1820 = 0x7a;
    loc_20.function = "run";
    loc_20.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_20.line = 0x7a;
    assertFail(local_1748,loc_20);
  }
  local_17e9 = 0;
  local_17ea = 0;
  local_17eb = 0;
  local_1811 = 0;
  local_1812 = 0;
  local_1813 = 0;
  tr__22._4_4_ = log10floor<unsigned_int>(0x10);
  local_1838 = (uint *)((long)&tr__22 + 4);
  local_184c = 1;
  _cmp__22 = &local_184c;
  local_1850 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1838,_cmp__22);
  local_1901 = 0;
  local_1902 = 0;
  local_1903 = 0;
  local_1929 = 0;
  local_192a = 0;
  local_192b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1900,local_1838);
    local_1901 = 1;
    std::operator+(&local_18e0,
                   "Comparison failed: log10floor<std::uint32_t>(16u) == 1u (with \"log10floor<std::uint32_t>(16u)\"="
                   ,&local_1900);
    local_1902 = 1;
    std::operator+(&local_18c0,&local_18e0,", \"1u\"=");
    local_1903 = 1;
    stringify<unsigned_int>(&local_1928,_cmp__22);
    local_1929 = 1;
    std::operator+(&local_18a0,&local_18c0,&local_1928);
    local_192a = 1;
    std::operator+(&local_1880,&local_18a0,")");
    local_192b = 1;
    local_1860 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1880);
    tl__23 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1940 = "run";
    local_1938 = 0x7b;
    loc_21.function = "run";
    loc_21.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_21.line = 0x7b;
    assertFail(local_1860,loc_21);
  }
  local_1901 = 0;
  local_1902 = 0;
  local_1903 = 0;
  local_1929 = 0;
  local_192a = 0;
  local_192b = 0;
  tr__23._4_4_ = log10floor<unsigned_int>(99);
  local_1950 = (uint *)((long)&tr__23 + 4);
  local_1964 = 1;
  _cmp__23 = &local_1964;
  local_1968 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1950,_cmp__23);
  local_1a19 = 0;
  local_1a1a = 0;
  local_1a1b = 0;
  local_1a41 = 0;
  local_1a42 = 0;
  local_1a43 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1a18,local_1950);
    local_1a19 = 1;
    std::operator+(&local_19f8,
                   "Comparison failed: log10floor<std::uint32_t>(99u) == 1u (with \"log10floor<std::uint32_t>(99u)\"="
                   ,&local_1a18);
    local_1a1a = 1;
    std::operator+(&local_19d8,&local_19f8,", \"1u\"=");
    local_1a1b = 1;
    stringify<unsigned_int>(&local_1a40,_cmp__23);
    local_1a41 = 1;
    std::operator+(&local_19b8,&local_19d8,&local_1a40);
    local_1a42 = 1;
    std::operator+(&local_1998,&local_19b8,")");
    local_1a43 = 1;
    local_1978 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1998);
    tl__24 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1a58 = "run";
    local_1a50 = 0x7c;
    loc_22.function = "run";
    loc_22.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_22.line = 0x7c;
    assertFail(local_1978,loc_22);
  }
  local_1a19 = 0;
  local_1a1a = 0;
  local_1a1b = 0;
  local_1a41 = 0;
  local_1a42 = 0;
  local_1a43 = 0;
  tr__24._4_4_ = log10floor<unsigned_int>(100);
  local_1a68 = (uint *)((long)&tr__24 + 4);
  local_1a7c = 2;
  _cmp__24 = &local_1a7c;
  local_1a80 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1a68,_cmp__24);
  local_1b31 = 0;
  local_1b32 = 0;
  local_1b33 = 0;
  local_1b59 = 0;
  local_1b5a = 0;
  local_1b5b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1b30,local_1a68);
    local_1b31 = 1;
    std::operator+(&local_1b10,
                   "Comparison failed: log10floor<std::uint32_t>(100u) == 2u (with \"log10floor<std::uint32_t>(100u)\"="
                   ,&local_1b30);
    local_1b32 = 1;
    std::operator+(&local_1af0,&local_1b10,", \"2u\"=");
    local_1b33 = 1;
    stringify<unsigned_int>(&local_1b58,_cmp__24);
    local_1b59 = 1;
    std::operator+(&local_1ad0,&local_1af0,&local_1b58);
    local_1b5a = 1;
    std::operator+(&local_1ab0,&local_1ad0,")");
    local_1b5b = 1;
    local_1a90 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1ab0);
    tl__25 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1b70 = "run";
    local_1b68 = 0x7d;
    loc_23.function = "run";
    loc_23.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_23.line = 0x7d;
    assertFail(local_1a90,loc_23);
  }
  local_1b31 = 0;
  local_1b32 = 0;
  local_1b33 = 0;
  local_1b59 = 0;
  local_1b5a = 0;
  local_1b5b = 0;
  tr__25._4_4_ = log10floor<unsigned_int>(999);
  local_1b80 = (uint *)((long)&tr__25 + 4);
  local_1b94 = 2;
  _cmp__25 = &local_1b94;
  local_1b98 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1b80,_cmp__25);
  local_1c49 = 0;
  local_1c4a = 0;
  local_1c4b = 0;
  local_1c71 = 0;
  local_1c72 = 0;
  local_1c73 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1c48,local_1b80);
    local_1c49 = 1;
    std::operator+(&local_1c28,
                   "Comparison failed: log10floor<std::uint32_t>(999u) == 2u (with \"log10floor<std::uint32_t>(999u)\"="
                   ,&local_1c48);
    local_1c4a = 1;
    std::operator+(&local_1c08,&local_1c28,", \"2u\"=");
    local_1c4b = 1;
    stringify<unsigned_int>(&local_1c70,_cmp__25);
    local_1c71 = 1;
    std::operator+(&local_1be8,&local_1c08,&local_1c70);
    local_1c72 = 1;
    std::operator+(&local_1bc8,&local_1be8,")");
    local_1c73 = 1;
    local_1ba8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1bc8);
    tl__26 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1c88 = "run";
    local_1c80 = 0x7e;
    loc_24.function = "run";
    loc_24.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_24.line = 0x7e;
    assertFail(local_1ba8,loc_24);
  }
  local_1c49 = 0;
  local_1c4a = 0;
  local_1c4b = 0;
  local_1c71 = 0;
  local_1c72 = 0;
  local_1c73 = 0;
  tr__26._4_4_ = log10floor<unsigned_int>(1000);
  local_1c98 = (uint *)((long)&tr__26 + 4);
  local_1cac = 3;
  _cmp__26 = &local_1cac;
  local_1cb0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1c98,_cmp__26);
  local_1d61 = 0;
  local_1d62 = 0;
  local_1d63 = 0;
  local_1d89 = 0;
  local_1d8a = 0;
  local_1d8b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1d60,local_1c98);
    local_1d61 = 1;
    std::operator+(&local_1d40,
                   "Comparison failed: log10floor<std::uint32_t>(1\'000u) == 3u (with \"log10floor<std::uint32_t>(1\'000u)\"="
                   ,&local_1d60);
    local_1d62 = 1;
    std::operator+(&local_1d20,&local_1d40,", \"3u\"=");
    local_1d63 = 1;
    stringify<unsigned_int>(&local_1d88,_cmp__26);
    local_1d89 = 1;
    std::operator+(&local_1d00,&local_1d20,&local_1d88);
    local_1d8a = 1;
    std::operator+(&local_1ce0,&local_1d00,")");
    local_1d8b = 1;
    local_1cc0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1ce0);
    tl__27 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1da0 = "run";
    local_1d98 = 0x7f;
    loc_25.function = "run";
    loc_25.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_25.line = 0x7f;
    assertFail(local_1cc0,loc_25);
  }
  local_1d61 = 0;
  local_1d62 = 0;
  local_1d63 = 0;
  local_1d89 = 0;
  local_1d8a = 0;
  local_1d8b = 0;
  tr__27._4_4_ = log10floor<unsigned_int>(9999);
  local_1db0 = (uint *)((long)&tr__27 + 4);
  local_1dc4 = 3;
  _cmp__27 = &local_1dc4;
  local_1dc8 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1db0,_cmp__27);
  local_1e79 = 0;
  local_1e7a = 0;
  local_1e7b = 0;
  local_1ea1 = 0;
  local_1ea2 = 0;
  local_1ea3 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1e78,local_1db0);
    local_1e79 = 1;
    std::operator+(&local_1e58,
                   "Comparison failed: log10floor<std::uint32_t>(9\'999u) == 3u (with \"log10floor<std::uint32_t>(9\'999u)\"="
                   ,&local_1e78);
    local_1e7a = 1;
    std::operator+(&local_1e38,&local_1e58,", \"3u\"=");
    local_1e7b = 1;
    stringify<unsigned_int>(&local_1ea0,_cmp__27);
    local_1ea1 = 1;
    std::operator+(&local_1e18,&local_1e38,&local_1ea0);
    local_1ea2 = 1;
    std::operator+(&local_1df8,&local_1e18,")");
    local_1ea3 = 1;
    local_1dd8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1df8);
    tl__28 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1eb8 = "run";
    local_1eb0 = 0x80;
    loc_26.function = "run";
    loc_26.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_26.line = 0x80;
    assertFail(local_1dd8,loc_26);
  }
  local_1e79 = 0;
  local_1e7a = 0;
  local_1e7b = 0;
  local_1ea1 = 0;
  local_1ea2 = 0;
  local_1ea3 = 0;
  tr__28._4_4_ = log10floor<unsigned_int>(10000);
  local_1ec8 = (uint *)((long)&tr__28 + 4);
  local_1edc = 4;
  _cmp__28 = &local_1edc;
  local_1ee0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1ec8,_cmp__28);
  local_1f91 = 0;
  local_1f92 = 0;
  local_1f93 = 0;
  local_1fb9 = 0;
  local_1fba = 0;
  local_1fbb = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_1f90,local_1ec8);
    local_1f91 = 1;
    std::operator+(&local_1f70,
                   "Comparison failed: log10floor<std::uint32_t>(10000u) == 4u (with \"log10floor<std::uint32_t>(10000u)\"="
                   ,&local_1f90);
    local_1f92 = 1;
    std::operator+(&local_1f50,&local_1f70,", \"4u\"=");
    local_1f93 = 1;
    stringify<unsigned_int>(&local_1fb8,_cmp__28);
    local_1fb9 = 1;
    std::operator+(&local_1f30,&local_1f50,&local_1fb8);
    local_1fba = 1;
    std::operator+(&local_1f10,&local_1f30,")");
    local_1fbb = 1;
    local_1ef0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f10);
    tl__29 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_1fd0 = "run";
    local_1fc8 = 0x81;
    loc_27.function = "run";
    loc_27.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_27.line = 0x81;
    assertFail(local_1ef0,loc_27);
  }
  local_1f91 = 0;
  local_1f92 = 0;
  local_1f93 = 0;
  local_1fb9 = 0;
  local_1fba = 0;
  local_1fbb = 0;
  tr__29._4_4_ = log10floor<unsigned_int>(99999);
  local_1fe0 = (uint *)((long)&tr__29 + 4);
  local_1ff4 = 4;
  _cmp__29 = &local_1ff4;
  local_1ff8 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_1fe0,_cmp__29);
  local_20a9 = 0;
  local_20aa = 0;
  local_20ab = 0;
  local_20d1 = 0;
  local_20d2 = 0;
  local_20d3 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_20a8,local_1fe0);
    local_20a9 = 1;
    std::operator+(&local_2088,
                   "Comparison failed: log10floor<std::uint32_t>(99\'999u) == 4u (with \"log10floor<std::uint32_t>(99\'999u)\"="
                   ,&local_20a8);
    local_20aa = 1;
    std::operator+(&local_2068,&local_2088,", \"4u\"=");
    local_20ab = 1;
    stringify<unsigned_int>(&local_20d0,_cmp__29);
    local_20d1 = 1;
    std::operator+(&local_2048,&local_2068,&local_20d0);
    local_20d2 = 1;
    std::operator+(&local_2028,&local_2048,")");
    local_20d3 = 1;
    local_2008 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2028);
    tl__30 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_20e8 = "run";
    local_20e0 = 0x82;
    loc_28.function = "run";
    loc_28.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_28.line = 0x82;
    assertFail(local_2008,loc_28);
  }
  local_20a9 = 0;
  local_20aa = 0;
  local_20ab = 0;
  local_20d1 = 0;
  local_20d2 = 0;
  local_20d3 = 0;
  tr__30._4_4_ = log10floor<unsigned_int>(100000);
  local_20f8 = (uint *)((long)&tr__30 + 4);
  local_210c = 5;
  _cmp__30 = &local_210c;
  local_2110 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_20f8,_cmp__30);
  local_21c1 = 0;
  local_21c2 = 0;
  local_21c3 = 0;
  local_21e9 = 0;
  local_21ea = 0;
  local_21eb = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_21c0,local_20f8);
    local_21c1 = 1;
    std::operator+(&local_21a0,
                   "Comparison failed: log10floor<std::uint32_t>(100\'000u) == 5u (with \"log10floor<std::uint32_t>(100\'000u)\"="
                   ,&local_21c0);
    local_21c2 = 1;
    std::operator+(&local_2180,&local_21a0,", \"5u\"=");
    local_21c3 = 1;
    stringify<unsigned_int>(&local_21e8,_cmp__30);
    local_21e9 = 1;
    std::operator+(&local_2160,&local_2180,&local_21e8);
    local_21ea = 1;
    std::operator+(&local_2140,&local_2160,")");
    local_21eb = 1;
    local_2120 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2140);
    tl__31 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_2200 = "run";
    local_21f8 = 0x83;
    loc_29.function = "run";
    loc_29.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_29.line = 0x83;
    assertFail(local_2120,loc_29);
  }
  local_21c1 = 0;
  local_21c2 = 0;
  local_21c3 = 0;
  local_21e9 = 0;
  local_21ea = 0;
  local_21eb = 0;
  tr__31._4_4_ = log10floor<unsigned_int>(999999);
  local_2210 = (uint *)((long)&tr__31 + 4);
  local_2224 = 5;
  _cmp__31 = &local_2224;
  local_2228 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2210,_cmp__31);
  local_22d9 = 0;
  local_22da = 0;
  local_22db = 0;
  local_2301 = 0;
  local_2302 = 0;
  local_2303 = 0;
  if (bVar1) {
    local_22d9 = 0;
    local_22da = 0;
    local_22db = 0;
    local_2301 = 0;
    local_2302 = 0;
    local_2303 = 0;
    tr__32._4_4_ = log10floor<unsigned_int>(1000000);
    local_2328 = (uint *)((long)&tr__32 + 4);
    local_233c = 6;
    _cmp__32 = &local_233c;
    local_2340 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2328,_cmp__32);
    local_23f1 = 0;
    local_23f2 = 0;
    local_23f3 = 0;
    local_2419 = 0;
    local_241a = 0;
    local_241b = 0;
    if (!bVar1) {
      stringify<unsigned_int>(&local_23f0,local_2328);
      local_23f1 = 1;
      std::operator+(&local_23d0,
                     "Comparison failed: log10floor<std::uint32_t>(1\'000\'000u) == 6u (with \"log10floor<std::uint32_t>(1\'000\'000u)\"="
                     ,&local_23f0);
      local_23f2 = 1;
      std::operator+(&local_23b0,&local_23d0,", \"6u\"=");
      local_23f3 = 1;
      stringify<unsigned_int>(&local_2418,_cmp__32);
      local_2419 = 1;
      std::operator+(&local_2390,&local_23b0,&local_2418);
      local_241a = 1;
      std::operator+(&local_2370,&local_2390,")");
      local_241b = 1;
      local_2350 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2370);
      tl__33 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
      pcStack_2430 = "run";
      local_2428 = 0x85;
      loc_31.function = "run";
      loc_31.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
      loc_31.line = 0x85;
      assertFail(local_2350,loc_31);
    }
    local_23f1 = 0;
    local_23f2 = 0;
    local_23f3 = 0;
    local_2419 = 0;
    local_241a = 0;
    local_241b = 0;
    tr__33._4_4_ = log10floor<unsigned_int>(9999999);
    local_2440 = (uint *)((long)&tr__33 + 4);
    local_2454 = 6;
    _cmp__33 = &local_2454;
    local_2458 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2440,_cmp__33);
    local_2509 = 0;
    local_250a = 0;
    local_250b = 0;
    local_2531 = 0;
    local_2532 = 0;
    local_2533 = 0;
    if (!bVar1) {
      stringify<unsigned_int>(&local_2508,local_2440);
      local_2509 = 1;
      std::operator+(&local_24e8,
                     "Comparison failed: log10floor<std::uint32_t>(9\'999\'999u) == 6u (with \"log10floor<std::uint32_t>(9\'999\'999u)\"="
                     ,&local_2508);
      local_250a = 1;
      std::operator+(&local_24c8,&local_24e8,", \"6u\"=");
      local_250b = 1;
      stringify<unsigned_int>(&local_2530,_cmp__33);
      local_2531 = 1;
      std::operator+(&local_24a8,&local_24c8,&local_2530);
      local_2532 = 1;
      std::operator+(&local_2488,&local_24a8,")");
      local_2533 = 1;
      local_2468 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2488);
      tl__34 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
      pcStack_2548 = "run";
      local_2540 = 0x86;
      loc_32.function = "run";
      loc_32.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
      loc_32.line = 0x86;
      assertFail(local_2468,loc_32);
    }
    local_2509 = 0;
    local_250a = 0;
    local_250b = 0;
    local_2531 = 0;
    local_2532 = 0;
    local_2533 = 0;
    tr__34._4_4_ = log10floor<unsigned_int>(10000000);
    local_2558 = (uint *)((long)&tr__34 + 4);
    local_256c = 7;
    _cmp__34 = &local_256c;
    local_2570 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2558,_cmp__34);
    local_2621 = 0;
    local_2622 = 0;
    local_2623 = 0;
    local_2649 = 0;
    local_264a = 0;
    local_264b = 0;
    if (!bVar1) {
      stringify<unsigned_int>(&local_2620,local_2558);
      local_2621 = 1;
      std::operator+(&local_2600,
                     "Comparison failed: log10floor<std::uint32_t>(10\'000\'000u) == 7u (with \"log10floor<std::uint32_t>(10\'000\'000u)\"="
                     ,&local_2620);
      local_2622 = 1;
      std::operator+(&local_25e0,&local_2600,", \"7u\"=");
      local_2623 = 1;
      stringify<unsigned_int>(&local_2648,_cmp__34);
      local_2649 = 1;
      std::operator+(&local_25c0,&local_25e0,&local_2648);
      local_264a = 1;
      std::operator+(&local_25a0,&local_25c0,")");
      local_264b = 1;
      local_2580 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_25a0);
      tl__35 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
      pcStack_2660 = "run";
      local_2658 = 0x87;
      loc_33.function = "run";
      loc_33.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
      loc_33.line = 0x87;
      assertFail(local_2580,loc_33);
    }
    local_2621 = 0;
    local_2622 = 0;
    local_2623 = 0;
    local_2649 = 0;
    local_264a = 0;
    local_264b = 0;
    tr__35._4_4_ = log10floor<unsigned_int>(99999999);
    local_2670 = (uint *)((long)&tr__35 + 4);
    local_2684 = 7;
    _cmp__35 = &local_2684;
    local_2688 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2670,_cmp__35);
    local_2739 = 0;
    local_273a = 0;
    local_273b = 0;
    local_2761 = 0;
    local_2762 = 0;
    local_2763 = 0;
    if (!bVar1) {
      stringify<unsigned_int>(&local_2738,local_2670);
      local_2739 = 1;
      std::operator+(&local_2718,
                     "Comparison failed: log10floor<std::uint32_t>(99\'999\'999u) == 7u (with \"log10floor<std::uint32_t>(99\'999\'999u)\"="
                     ,&local_2738);
      local_273a = 1;
      std::operator+(&local_26f8,&local_2718,", \"7u\"=");
      local_273b = 1;
      stringify<unsigned_int>(&local_2760,_cmp__35);
      local_2761 = 1;
      std::operator+(&local_26d8,&local_26f8,&local_2760);
      local_2762 = 1;
      std::operator+(&local_26b8,&local_26d8,")");
      local_2763 = 1;
      local_2698 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_26b8);
      tl__36 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
      pcStack_2778 = "run";
      local_2770 = 0x88;
      loc_34.function = "run";
      loc_34.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
      loc_34.line = 0x88;
      assertFail(local_2698,loc_34);
    }
    local_2739 = 0;
    local_273a = 0;
    local_273b = 0;
    local_2761 = 0;
    local_2762 = 0;
    local_2763 = 0;
    tr__36._4_4_ = log10floor<unsigned_int>(100000000);
    local_2788 = (uint *)((long)&tr__36 + 4);
    local_279c = 8;
    _cmp__36 = &local_279c;
    local_27a0 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2788,_cmp__36);
    local_2851 = 0;
    local_2852 = 0;
    local_2853 = 0;
    local_2879 = 0;
    local_287a = 0;
    local_287b = 0;
    if (!bVar1) {
      stringify<unsigned_int>(&local_2850,local_2788);
      local_2851 = 1;
      std::operator+(&local_2830,
                     "Comparison failed: log10floor<std::uint32_t>(100\'000\'000u) == 8u (with \"log10floor<std::uint32_t>(100\'000\'000u)\"="
                     ,&local_2850);
      local_2852 = 1;
      std::operator+(&local_2810,&local_2830,", \"8u\"=");
      local_2853 = 1;
      stringify<unsigned_int>(&local_2878,_cmp__36);
      local_2879 = 1;
      std::operator+(&local_27f0,&local_2810,&local_2878);
      local_287a = 1;
      std::operator+(&local_27d0,&local_27f0,")");
      local_287b = 1;
      local_27b0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_27d0);
      tl__37 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
      pcStack_2890 = "run";
      local_2888 = 0x89;
      loc_35.function = "run";
      loc_35.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
      loc_35.line = 0x89;
      assertFail(local_27b0,loc_35);
    }
    local_2851 = 0;
    local_2852 = 0;
    local_2853 = 0;
    local_2879 = 0;
    local_287a = 0;
    local_287b = 0;
    tr__37._4_4_ = log10floor<unsigned_int>(999999999);
    local_28a0 = (uint *)((long)&tr__37 + 4);
    local_28b4 = 8;
    _cmp__37 = &local_28b4;
    local_28b8 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_28a0,_cmp__37);
    local_2969 = 0;
    local_296a = 0;
    local_296b = 0;
    local_2991 = 0;
    local_2992 = 0;
    local_2993 = 0;
    if (!bVar1) {
      stringify<unsigned_int>(&local_2968,local_28a0);
      local_2969 = 1;
      std::operator+(&local_2948,
                     "Comparison failed: log10floor<std::uint32_t>(999\'999\'999u) == 8u (with \"log10floor<std::uint32_t>(999\'999\'999u)\"="
                     ,&local_2968);
      local_296a = 1;
      std::operator+(&local_2928,&local_2948,", \"8u\"=");
      local_296b = 1;
      stringify<unsigned_int>(&local_2990,_cmp__37);
      local_2991 = 1;
      std::operator+(&local_2908,&local_2928,&local_2990);
      local_2992 = 1;
      std::operator+(&local_28e8,&local_2908,")");
      local_2993 = 1;
      local_28c8 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_28e8);
      tl__38 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
      pcStack_29a8 = "run";
      local_29a0 = 0x8a;
      loc_36.function = "run";
      loc_36.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
      loc_36.line = 0x8a;
      assertFail(local_28c8,loc_36);
    }
    local_2969 = 0;
    local_296a = 0;
    local_296b = 0;
    local_2991 = 0;
    local_2992 = 0;
    local_2993 = 0;
    tr__38._4_4_ = log10floor<unsigned_int>(1000000000);
    local_29b8 = (uint *)((long)&tr__38 + 4);
    local_29cc = 9;
    _cmp__38 = &local_29cc;
    local_29d0 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_29b8,_cmp__38);
    local_2a81 = 0;
    local_2a82 = 0;
    local_2a83 = 0;
    local_2aa9 = 0;
    local_2aaa = 0;
    local_2aab = 0;
    if (!bVar1) {
      stringify<unsigned_int>(&local_2a80,local_29b8);
      local_2a81 = 1;
      std::operator+(&local_2a60,
                     "Comparison failed: log10floor<std::uint32_t>(1\'000\'000\'000u) == 9u (with \"log10floor<std::uint32_t>(1\'000\'000\'000u)\"="
                     ,&local_2a80);
      local_2a82 = 1;
      std::operator+(&local_2a40,&local_2a60,", \"9u\"=");
      local_2a83 = 1;
      stringify<unsigned_int>(&local_2aa8,_cmp__38);
      local_2aa9 = 1;
      std::operator+(&local_2a20,&local_2a40,&local_2aa8);
      local_2aaa = 1;
      std::operator+(&local_2a00,&local_2a20,")");
      local_2aab = 1;
      local_29e0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2a00);
      tl__39 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
      pcStack_2ac0 = "run";
      local_2ab8 = 0x8b;
      loc_37.function = "run";
      loc_37.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
      loc_37.line = 0x8b;
      assertFail(local_29e0,loc_37);
    }
    local_2a81 = 0;
    local_2a82 = 0;
    local_2a83 = 0;
    local_2aa9 = 0;
    local_2aaa = 0;
    local_2aab = 0;
    tr__39._4_4_ = log10floor<unsigned_int>(2000000000);
    local_2ad0 = (uint *)((long)&tr__39 + 4);
    local_2ae4 = 9;
    _cmp__39 = &local_2ae4;
    local_2ae8 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2ad0,_cmp__39);
    local_2b99 = 0;
    local_2b9a = 0;
    local_2b9b = 0;
    local_2bc1 = 0;
    local_2bc2 = 0;
    local_2bc3 = 0;
    if (bVar1) {
      local_2b99 = 0;
      local_2b9a = 0;
      local_2b9b = 0;
      local_2bc1 = 0;
      local_2bc2 = 0;
      local_2bc3 = 0;
      tr__40._4_4_ = log10floor<unsigned_int>(4000000000);
      local_2be8 = (uint *)((long)&tr__40 + 4);
      local_2bfc = 9;
      _cmp__40 = &local_2bfc;
      local_2c00 = 0;
      bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2be8,_cmp__40);
      local_2cb1 = 0;
      local_2cb2 = 0;
      local_2cb3 = 0;
      local_2cd9 = 0;
      local_2cda = 0;
      local_2cdb = 0;
      if (!bVar1) {
        stringify<unsigned_int>(&local_2cb0,local_2be8);
        local_2cb1 = 1;
        std::operator+(&local_2c90,
                       "Comparison failed: log10floor<std::uint32_t>(4\'000\'000\'000u) == 9u (with \"log10floor<std::uint32_t>(4\'000\'000\'000u)\"="
                       ,&local_2cb0);
        local_2cb2 = 1;
        std::operator+(&local_2c70,&local_2c90,", \"9u\"=");
        local_2cb3 = 1;
        stringify<unsigned_int>(&local_2cd8,_cmp__40);
        local_2cd9 = 1;
        std::operator+(&local_2c50,&local_2c70,&local_2cd8);
        local_2cda = 1;
        std::operator+(&local_2c30,&local_2c50,")");
        local_2cdb = 1;
        local_2c10 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2c30)
        ;
        tl__41 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b
        ;
        pcStack_2cf0 = "run";
        local_2ce8 = 0x8d;
        loc_39.function = "run";
        loc_39.file = 
        "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp"
        ;
        loc_39.line = 0x8d;
        assertFail(local_2c10,loc_39);
      }
      local_2cb1 = 0;
      local_2cb2 = 0;
      local_2cb3 = 0;
      local_2cd9 = 0;
      local_2cda = 0;
      local_2cdb = 0;
      tr__41._4_4_ = log10floor<unsigned_int>(0xffffffff);
      local_2d00 = (uint *)((long)&tr__41 + 4);
      local_2d14 = 9;
      _cmp__41 = &local_2d14;
      local_2d18 = 0;
      bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_2d00,_cmp__41);
      local_2dc9 = 0;
      local_2dca = 0;
      local_2dcb = 0;
      local_2df1 = 0;
      local_2df2 = 0;
      local_2df3 = 0;
      if (!bVar1) {
        stringify<unsigned_int>(&local_2dc8,local_2d00);
        local_2dc9 = 1;
        std::operator+(&local_2da8,
                       "Comparison failed: log10floor<std::uint32_t>(std::uint32_t(~0)) == 9u (with \"log10floor<std::uint32_t>(std::uint32_t(~0))\"="
                       ,&local_2dc8);
        local_2dca = 1;
        std::operator+(&local_2d88,&local_2da8,", \"9u\"=");
        local_2dcb = 1;
        stringify<unsigned_int>(&local_2df0,_cmp__41);
        local_2df1 = 1;
        std::operator+(&local_2d68,&local_2d88,&local_2df0);
        local_2df2 = 1;
        std::operator+(&local_2d48,&local_2d68,")");
        local_2df3 = 1;
        local_2d28 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2d48)
        ;
        tl__42 = (enable_if_t<std::is_unsigned_v<unsigned_long>,_unsigned_long> *)
                 anon_var_dwarf_4200b;
        pcStack_2e08 = "run";
        local_2e00 = 0x8e;
        loc_40.function = "run";
        loc_40.file = 
        "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp"
        ;
        loc_40.line = 0x8e;
        assertFail(local_2d28,loc_40);
      }
      local_2dc9 = 0;
      local_2dca = 0;
      local_2dcb = 0;
      local_2df1 = 0;
      local_2df2 = 0;
      local_2df3 = 0;
      tr__42 = (uint *)log10floor<unsigned_long>(0x8000000000000000);
      local_2e18 = &tr__42;
      local_2e2c = 0x12;
      _cmp__42 = &local_2e2c;
      local_2e30 = 0;
      bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                        ((unsigned_long *)local_2e18,_cmp__42);
      local_2ee1 = 0;
      local_2ee2 = 0;
      local_2ee3 = 0;
      local_2f09 = 0;
      local_2f0a = 0;
      local_2f0b = 0;
      if (!bVar1) {
        stringify<unsigned_long>(&local_2ee0,(unsigned_long *)local_2e18);
        local_2ee1 = 1;
        std::operator+(&local_2ec0,
                       "Comparison failed: log10floor<std::uint64_t>(std::uint64_t{1} << 63) == 18u (with \"log10floor<std::uint64_t>(std::uint64_t{1} << 63)\"="
                       ,&local_2ee0);
        local_2ee2 = 1;
        std::operator+(&local_2ea0,&local_2ec0,", \"18u\"=");
        local_2ee3 = 1;
        stringify<unsigned_int>(&local_2f08,_cmp__42);
        local_2f09 = 1;
        std::operator+(&local_2e80,&local_2ea0,&local_2f08);
        local_2f0a = 1;
        std::operator+(&local_2e60,&local_2e80,")");
        local_2f0b = 1;
        local_2e40 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2e60)
        ;
        tl__43 = (enable_if_t<std::is_unsigned_v<unsigned_long>,_unsigned_long> *)
                 anon_var_dwarf_4200b;
        pcStack_2f20 = "run";
        local_2f18 = 0x90;
        loc_41.function = "run";
        loc_41.file = 
        "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp"
        ;
        loc_41.line = 0x90;
        assertFail(local_2e40,loc_41);
      }
      local_2ee1 = 0;
      local_2ee2 = 0;
      local_2ee3 = 0;
      local_2f09 = 0;
      local_2f0a = 0;
      local_2f0b = 0;
      tr__43 = (uint *)log10floor<unsigned_long>(9999999999999999999);
      local_2f30 = &tr__43;
      local_2f44 = 0x12;
      _cmp__43 = &local_2f44;
      local_2f48 = 0;
      bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                        ((unsigned_long *)local_2f30,_cmp__43);
      local_2ff9 = 0;
      local_2ffa = 0;
      local_2ffb = 0;
      local_3021 = 0;
      local_3022 = 0;
      local_3023 = 0;
      if (bVar1) {
        local_2ff9 = 0;
        local_2ffa = 0;
        local_2ffb = 0;
        local_3021 = 0;
        local_3022 = 0;
        local_3023 = 0;
        tr__44 = (uint *)log10floor<unsigned_long>(10000000000000000000);
        local_3048 = &tr__44;
        local_305c = 0x13;
        _cmp__44 = &local_305c;
        local_3060 = 0;
        bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                          ((unsigned_long *)local_3048,_cmp__44);
        local_3111 = 0;
        local_3112 = 0;
        local_3113 = 0;
        local_3139 = 0;
        local_313a = 0;
        local_313b = 0;
        if (!bVar1) {
          stringify<unsigned_long>(&local_3110,(unsigned_long *)local_3048);
          local_3111 = 1;
          std::operator+(&local_30f0,
                         "Comparison failed: log10floor<std::uint64_t>(10\'000\'000\'000\'000\'000\'000ull) == 19u (with \"log10floor<std::uint64_t>(10\'000\'000\'000\'000\'000\'000ull)\"="
                         ,&local_3110);
          local_3112 = 1;
          std::operator+(&local_30d0,&local_30f0,", \"19u\"=");
          local_3113 = 1;
          stringify<unsigned_int>(&local_3138,_cmp__44);
          local_3139 = 1;
          std::operator+(&local_30b0,&local_30d0,&local_3138);
          local_313a = 1;
          std::operator+(&local_3090,&local_30b0,")");
          local_313b = 1;
          local_3070 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&local_3090);
          tl__45 = (enable_if_t<std::is_unsigned_v<unsigned_long>,_unsigned_long> *)
                   anon_var_dwarf_4200b;
          pcStack_3150 = "run";
          local_3148 = 0x92;
          loc_43.function = "run";
          loc_43.file = 
          "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp"
          ;
          loc_43.line = 0x92;
          assertFail(local_3070,loc_43);
        }
        local_3111 = 0;
        local_3112 = 0;
        local_3113 = 0;
        local_3139 = 0;
        local_313a = 0;
        local_313b = 0;
        tr__45 = (uint *)log10floor<unsigned_long>(0xffffffffffffffff);
        local_3160 = &tr__45;
        local_3174 = 0x13;
        _cmp__45 = &local_3174;
        local_3178 = 0;
        bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                          ((unsigned_long *)local_3160,_cmp__45);
        local_3229 = 0;
        local_322a = 0;
        local_322b = 0;
        if (!bVar1) {
          stringify<unsigned_long>(&local_3228,(unsigned_long *)local_3160);
          local_3229 = 1;
          std::operator+(&local_3208,
                         "Comparison failed: log10floor<std::uint64_t>(~std::uint64_t{0}) == 19u (with \"log10floor<std::uint64_t>(~std::uint64_t{0})\"="
                         ,&local_3228);
          local_322a = 1;
          std::operator+(&local_31e8,&local_3208,", \"19u\"=");
          local_322b = 1;
          stringify<unsigned_int>(&local_3250,_cmp__45);
          std::operator+(&local_31c8,&local_31e8,&local_3250);
          std::operator+(&local_31a8,&local_31c8,")");
          local_3188 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&local_31a8);
          loc_44.function = "run";
          loc_44.file = 
          "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp"
          ;
          loc_44.line = 0x93;
          assertFail(local_3188,loc_44);
        }
        return;
      }
      stringify<unsigned_long>(&local_2ff8,(unsigned_long *)local_2f30);
      local_2ff9 = 1;
      std::operator+(&local_2fd8,
                     "Comparison failed: log10floor<std::uint64_t>(9\'999\'999\'999\'999\'999\'999ull) == 18u (with \"log10floor<std::uint64_t>(9\'999\'999\'999\'999\'999\'999ull)\"="
                     ,&local_2ff8);
      local_2ffa = 1;
      std::operator+(&local_2fb8,&local_2fd8,", \"18u\"=");
      local_2ffb = 1;
      stringify<unsigned_int>(&local_3020,_cmp__43);
      local_3021 = 1;
      std::operator+(&local_2f98,&local_2fb8,&local_3020);
      local_3022 = 1;
      std::operator+(&local_2f78,&local_2f98,")");
      local_3023 = 1;
      local_2f58 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2f78);
      tl__44 = (enable_if_t<std::is_unsigned_v<unsigned_long>,_unsigned_long> *)anon_var_dwarf_4200b
      ;
      pcStack_3038 = "run";
      local_3030 = 0x91;
      loc_42.function = "run";
      loc_42.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
      loc_42.line = 0x91;
      assertFail(local_2f58,loc_42);
    }
    stringify<unsigned_int>(&local_2b98,local_2ad0);
    local_2b99 = 1;
    std::operator+(&local_2b78,
                   "Comparison failed: log10floor<std::uint32_t>(2\'000\'000\'000u) == 9u (with \"log10floor<std::uint32_t>(2\'000\'000\'000u)\"="
                   ,&local_2b98);
    local_2b9a = 1;
    std::operator+(&local_2b58,&local_2b78,", \"9u\"=");
    local_2b9b = 1;
    stringify<unsigned_int>(&local_2bc0,_cmp__39);
    local_2bc1 = 1;
    std::operator+(&local_2b38,&local_2b58,&local_2bc0);
    local_2bc2 = 1;
    std::operator+(&local_2b18,&local_2b38,")");
    local_2bc3 = 1;
    local_2af8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2b18);
    tl__40 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
    pcStack_2bd8 = "run";
    local_2bd0 = 0x8c;
    loc_38.function = "run";
    loc_38.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_38.line = 0x8c;
    assertFail(local_2af8,loc_38);
  }
  stringify<unsigned_int>(&local_22d8,local_2210);
  local_22d9 = 1;
  std::operator+(&local_22b8,
                 "Comparison failed: log10floor<std::uint32_t>(999\'999u) == 5u (with \"log10floor<std::uint32_t>(999\'999u)\"="
                 ,&local_22d8);
  local_22da = 1;
  std::operator+(&local_2298,&local_22b8,", \"5u\"=");
  local_22db = 1;
  stringify<unsigned_int>(&local_2300,_cmp__31);
  local_2301 = 1;
  std::operator+(&local_2278,&local_2298,&local_2300);
  local_2302 = 1;
  std::operator+(&local_2258,&local_2278,")");
  local_2303 = 1;
  local_2238 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2258);
  tl__32 = (enable_if_t<std::is_unsigned_v<unsigned_int>,_unsigned_int> *)anon_var_dwarf_4200b;
  pcStack_2318 = "run";
  local_2310 = 0x84;
  loc_30.function = "run";
  loc_30.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  loc_30.line = 0x84;
  assertFail(local_2238,loc_30);
}

Assistant:

BITMANIP_TEST(intlog, log10floor_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(9u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(10u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(99u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(100u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(255u), 2u);

    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(2u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(3u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(4u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(5u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(6u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(7u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(8u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(11u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(12u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(13u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(14u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(15u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(16u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000u), 3u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9'999u), 3u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10000u), 4u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99'999u), 4u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100'000u), 5u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999'999u), 5u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000'000u), 6u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9'999'999u), 6u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10'000'000u), 7u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99'999'999u), 7u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100'000'000u), 8u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999'999'999u), 8u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(2'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(4'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(std::uint32_t(~0)), 9u);

    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(std::uint64_t{1} << 63), 18u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(9'999'999'999'999'999'999ull), 18u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(10'000'000'000'000'000'000ull), 19u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(~std::uint64_t{0}), 19u);
}